

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<kj::Own<kj::AsyncCapabilityStream>_> __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncCapabilityStream>_>,_kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1823:13),_kj::_::PropagateException>
::anon_class_1_0_00000001_for_func::operator()
          (anon_class_1_0_00000001_for_func *this,Maybe<kj::Own<kj::AsyncCapabilityStream>_> *result
          )

{
  AsyncCapabilityStream *pAVar1;
  char *pcVar2;
  size_t sVar3;
  char (*in_RCX) [41];
  long *in_RDX;
  ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>_> *pIVar4;
  ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>_> *extraout_RDX;
  ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>_> *extraout_RDX_00;
  ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>_> *extraout_RDX_01;
  Own<kj::_::ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>_>_> OVar5;
  Promise<kj::Own<kj::AsyncCapabilityStream>_> PVar6;
  Own<kj::AsyncCapabilityStream> local_1b8;
  String local_1a8;
  undefined8 local_188;
  undefined8 uStack_180;
  Exception local_178;
  
  local_1b8.ptr = (AsyncCapabilityStream *)in_RDX[1];
  if (local_1b8.ptr == (AsyncCapabilityStream *)0x0) {
    Debug::makeDescription<char_const(&)[41]>
              (&local_1a8,(Debug *)"\"EOF when expecting to receive capability\"",
               "EOF when expecting to receive capability",in_RCX);
    Exception::Exception
              (&local_178,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x724,&local_1a8);
    heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_188,&local_178);
    *(undefined8 *)this = local_188;
    *(undefined8 *)(this + 8) = uStack_180;
    Exception::~Exception(&local_178);
    sVar3 = local_1a8.content.size_;
    pcVar2 = local_1a8.content.ptr;
    pIVar4 = extraout_RDX_00;
    if (local_1a8.content.ptr != (char *)0x0) {
      local_1a8.content.ptr = (char *)0x0;
      local_1a8.content.size_ = 0;
      (**(local_1a8.content.disposer)->_vptr_ArrayDisposer)
                (local_1a8.content.disposer,pcVar2,1,sVar3,sVar3,0);
      pIVar4 = extraout_RDX_01;
    }
  }
  else {
    local_1b8.disposer = (Disposer *)*in_RDX;
    in_RDX[1] = 0;
    OVar5 = heap<kj::_::ImmediatePromiseNode<kj::Own<kj::AsyncCapabilityStream>>,kj::Own<kj::AsyncCapabilityStream>>
                      ((kj *)&local_178,&local_1b8);
    pAVar1 = local_1b8.ptr;
    pIVar4 = OVar5.ptr;
    *(undefined4 *)this = local_178.ownFile.content.ptr._0_4_;
    *(undefined4 *)(this + 4) = local_178.ownFile.content.ptr._4_4_;
    *(undefined4 *)(this + 8) = (undefined4)local_178.ownFile.content.size_;
    *(undefined4 *)(this + 0xc) = local_178.ownFile.content.size_._4_4_;
    if (local_1b8.ptr != (AsyncCapabilityStream *)0x0) {
      local_1b8.ptr = (AsyncCapabilityStream *)0x0;
      (**(local_1b8.disposer)->_vptr_Disposer)
                (local_1b8.disposer,
                 (pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[-2] +
                 (long)&(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream)
      ;
      pIVar4 = extraout_RDX;
    }
  }
  PVar6.super_PromiseBase.node.ptr = (PromiseNode *)pIVar4;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Own<kj::AsyncCapabilityStream>_>)PVar6.super_PromiseBase.node;
}

Assistant:

KJ_IF_MAYBE(r, result) {
      return kj::mv(*r);
    }